

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitblt.c
# Opt level: O3

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl,LispPTR tos)

{
  DLword *ybase;
  DLword *pDVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  DLword DVar6;
  ushort uVar7;
  ushort uVar8;
  bool bVar9;
  uint uVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  uint *puVar19;
  sbyte sVar20;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint *puVar31;
  uint *puVar32;
  int iVar33;
  uint *puVar34;
  uint *puVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint *puVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_114;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  DLword *local_d8;
  uint *local_a0;
  sbyte sVar21;
  
  uVar29 = (ulong)pilot_bt_tbl;
  if (kbd_for_makeinit == 0) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }
  if ((pilot_bt_tbl & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar29);
  }
  uVar2 = Lisp_world[uVar29 + 9];
  uVar3 = Lisp_world[uVar29 + 8];
  if (uVar2 == 0 || uVar3 == 0) {
    return pilot_bt_tbl;
  }
  uVar4 = Lisp_world[uVar29 + 3];
  uVar5 = Lisp_world[uVar29 + 7];
  DVar6 = Lisp_world[uVar29 + 0xb];
  ScreenLocked = 1;
  local_d8 = Lisp_world +
             ((ulong)Lisp_world[uVar29 + 5] |
             (ulong)(uint)(*(int *)(Lisp_world + uVar29 + 4) << 0x10));
  ybase = Lisp_world +
          ((ulong)Lisp_world[uVar29 + 1] | (ulong)(uint)(*(int *)(Lisp_world + uVar29) << 0x10));
  uVar7 = Lisp_world[uVar29 + 6];
  iVar33 = (int)(short)uVar7;
  uVar47 = (uint)(short)Lisp_world[uVar29 + 2];
  uVar8 = Lisp_world[uVar29 + 0xb];
  uVar11 = uVar8 >> 0xb & 1;
  uVar12 = uVar8 >> 9 & 3;
  uVar40 = (uint)uVar2;
  if ((uVar8 >> 0xc & 1) == 0) {
    if ((short)DVar6 < 0) {
      uVar13 = ((uint)uVar2 + (uint)uVar4) - 1;
      uVar23 = (ulong)(uVar13 >> 3) + (long)ybase;
      local_11c = (uVar13 & 7) + ((uint)uVar23 & 3) * 8;
      iVar15 = local_11c - uVar2;
      uVar13 = iVar15 + 1U & 0x1f;
      local_124 = -1 << (~(byte)local_11c & 0x1f);
      local_128 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
      local_12c = local_128 & local_124;
      uVar25 = (local_11c ^ 0xffffffff) + (uint)uVar2;
      local_120 = uVar25 >> 5;
      if ((int)uVar25 < 1) {
        local_120 = 0;
      }
      uVar25 = ((uint)uVar2 + (uint)uVar5) - 1;
      uVar24 = (ulong)(uVar25 >> 3) + (long)local_d8;
      local_f4 = (uVar25 & 7) + ((uint)uVar24 & 3) * 8;
      iVar37 = local_f4 - uVar40;
      local_f8 = iVar15 - iVar37;
      uVar25 = iVar37 + 1U & 0x1f;
      uVar36 = iVar37 - iVar15 & 0x1f;
      local_f0 = ~(-1 << (sbyte)uVar36);
    }
    else {
      uVar23 = (ulong)(uVar4 >> 3) + (long)ybase;
      uVar13 = (uVar4 & 7) + ((uint)uVar23 & 3) * 8;
      local_11c = (uVar2 + uVar13) - 1 & 0x1f;
      local_124 = -(uint)(uVar13 == 0) | -1 << (-(char)uVar13 & 0x1fU) ^ 0xffffffffU;
      local_128 = -1 << (~(byte)local_11c & 0x1f);
      local_12c = local_128 & local_124;
      local_120 = (uVar13 + uVar2 >> 5) - 1;
      uVar24 = (ulong)(uVar5 >> 3) + (long)local_d8;
      uVar25 = (uVar5 & 7) + ((uint)uVar24 & 3) * 8;
      local_f4 = (uVar2 + uVar25) - 1 & 0x1f;
      local_f8 = uVar13 - uVar25;
      uVar36 = uVar25 - uVar13 & 0x1f;
      local_f0 = -(uint)(uVar36 == 0) | ~(-1 << (sbyte)uVar36);
    }
    local_f8 = local_f8 & 0x1f;
    puVar34 = (uint *)(uVar24 & 0xfffffffffffffffc);
    local_114 = (int)(short)(Lisp_world[uVar29 + 2] | uVar7);
  }
  else {
    uVar23 = (ulong)(uVar4 >> 3) + (long)ybase;
    uVar13 = (uVar4 & 7) + ((uint)uVar23 & 3) * 8;
    local_11c = (uVar2 + uVar13) - 1 & 0x1f;
    uVar36 = 0;
    local_128 = -1 << (~(byte)local_11c & 0x1f);
    local_124 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
    local_12c = local_128 & local_124;
    local_120 = (uVar13 + uVar2 >> 5) - 1;
    uVar25 = uVar5 & 0xf;
    local_f0 = 0;
    local_f4 = 0;
    puVar34 = (uint *)0x0;
    local_f8 = 0;
    local_114 = uVar47;
  }
  uVar14 = uVar7 >> 8 & 0xf;
  iVar15 = 0x21 - uVar40;
  local_a0 = (uint *)(uVar23 & 0xfffffffffffffffc);
  uVar10 = -(uint)(uVar11 != 0);
  lVar17 = (long)((int)uVar47 >> 5);
  uVar26 = 0;
  puVar19 = puVar34;
  uVar42 = (uint)uVar3;
LAB_00111a9f:
  local_148 = local_f8;
  local_140 = local_12c;
  local_130 = local_128;
  local_144 = local_f0;
  puVar31 = puVar34;
  puVar35 = local_a0;
  uVar43 = uVar42;
  uVar46 = local_124;
  uVar41 = local_120;
  uVar48 = uVar13;
  uVar30 = uVar25;
  uVar16 = local_f4;
  uVar38 = local_11c;
  do {
    puVar32 = puVar35;
    uVar28 = local_140;
    if ((uVar8 >> 0xc & 1) == 0) {
      sVar20 = (sbyte)uVar36;
      sVar21 = (sbyte)local_148;
      if ((short)DVar6 < 0) {
        if (uVar16 < uVar38) {
          uVar44 = *puVar19 >> sVar21 & local_144;
          if (uVar48 + 1 < uVar2 + uVar30) {
            puVar45 = puVar19 + -1;
            puVar19 = puVar19 + -2;
            uVar44 = uVar44 | *puVar45 << sVar20;
            uVar26 = *puVar45 >> sVar21 & local_144;
          }
          else {
            puVar19 = puVar19 + -1;
          }
        }
        else {
          uVar26 = *puVar19;
          puVar19 = puVar19 + -1;
          uVar44 = uVar26 << sVar20;
          uVar26 = uVar26 >> sVar21 & local_144;
        }
        uVar44 = uVar44 ^ uVar10;
        if (iVar15 <= (int)uVar48) {
          uVar28 = *puVar35;
          switch(uVar12) {
          case 1:
            uVar44 = uVar44 & uVar28;
            break;
          case 2:
            uVar44 = uVar44 | uVar28;
            break;
          case 3:
            uVar44 = uVar44 ^ uVar28;
          }
          *puVar35 = uVar44 & uVar46 | uVar28 & ~uVar46;
          puVar32 = puVar35 + -1;
          if (uVar30 == uVar48) {
            if (uVar11 == 0) {
              switch(uVar12) {
              case 0:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    uVar44 = *puVar19;
                    puVar19 = puVar19 + -1;
                    *puVar32 = uVar44;
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
                break;
              case 1:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    *puVar32 = *puVar32 & *puVar19;
                    puVar19 = puVar19 + -1;
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
                break;
              case 2:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    *puVar32 = *puVar32 | *puVar19;
                    puVar19 = puVar19 + -1;
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
                break;
              case 3:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    *puVar32 = *puVar32 ^ *puVar19;
                    puVar19 = puVar19 + -1;
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
              }
            }
            else {
              switch(uVar12) {
              case 0:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    uVar44 = *puVar19;
                    puVar19 = puVar19 + -1;
                    *puVar32 = ~uVar44;
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
                break;
              case 1:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    *puVar32 = *puVar32 & ~*puVar19;
                    puVar19 = puVar19 + -1;
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
                break;
              case 2:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    *puVar32 = *puVar32 | ~*puVar19;
                    puVar19 = puVar19 + -1;
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
                break;
              case 3:
                if (0 < (int)uVar41) {
                  uVar28 = uVar41 + 1;
                  do {
                    uVar44 = *puVar19;
                    puVar19 = puVar19 + -1;
                    *puVar32 = ~(uVar44 ^ *puVar32);
                    puVar32 = puVar32 + -1;
                    uVar28 = uVar28 - 1;
                  } while (1 < uVar28);
                }
              }
            }
          }
          else if (uVar11 == 0) {
            switch(uVar12) {
            case 0:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar22 = uVar44 << sVar20 | uVar26;
                  uVar26 = uVar44 >> sVar21;
                  *puVar32 = uVar22;
                  puVar32 = puVar32 + -1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 1:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                uVar44 = uVar26;
                do {
                  uVar22 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar26 = uVar22 >> sVar21;
                  *puVar32 = *puVar32 & (uVar22 << sVar20 | uVar44);
                  puVar32 = puVar32 + -1;
                  uVar28 = uVar28 - 1;
                  uVar44 = uVar26;
                } while (1 < uVar28);
              }
              break;
            case 2:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                puVar45 = puVar32;
                uVar44 = uVar26;
                do {
                  uVar22 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar26 = uVar22 >> sVar21;
                  puVar32 = puVar45 + -1;
                  *puVar45 = uVar44 | *puVar45 | uVar22 << sVar20;
                  uVar28 = uVar28 - 1;
                  puVar45 = puVar32;
                  uVar44 = uVar26;
                } while (1 < uVar28);
              }
              break;
            case 3:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                uVar44 = uVar26;
                do {
                  uVar22 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar26 = uVar22 >> sVar21;
                  *puVar32 = *puVar32 ^ (uVar22 << sVar20 | uVar44);
                  puVar32 = puVar32 + -1;
                  uVar28 = uVar28 - 1;
                  uVar44 = uVar26;
                } while (1 < uVar28);
              }
            }
          }
          else {
            switch(uVar12) {
            case 0:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar22 = uVar44 << sVar20 | uVar26;
                  uVar26 = uVar44 >> sVar21;
                  *puVar32 = ~uVar22;
                  puVar32 = puVar32 + -1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 1:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar22 = uVar44 << sVar20 | uVar26;
                  uVar26 = uVar44 >> sVar21;
                  *puVar32 = *puVar32 & ~uVar22;
                  puVar32 = puVar32 + -1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 2:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar22 = uVar44 << sVar20 | uVar26;
                  uVar26 = uVar44 >> sVar21;
                  *puVar32 = *puVar32 | ~uVar22;
                  puVar32 = puVar32 + -1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 3:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                puVar45 = puVar32;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + -1;
                  uVar22 = uVar44 << sVar20 | uVar26;
                  uVar26 = uVar44 >> sVar21;
                  puVar32 = puVar45 + -1;
                  *puVar45 = ~(uVar22 ^ *puVar45);
                  uVar28 = uVar28 - 1;
                  puVar45 = puVar32;
                } while (1 < uVar28);
              }
            }
          }
          if (uVar48 == 0) goto LAB_001123c6;
          uVar44 = uVar26;
          if (uVar48 <= uVar30) {
            uVar44 = *puVar19 << sVar20 | uVar26;
          }
          uVar44 = uVar44 ^ uVar10;
          uVar28 = local_130;
        }
LAB_00111d9a:
        uVar22 = *puVar32;
        uVar27 = ~uVar28 & uVar22;
        switch(uVar12) {
        case 1:
switchD_00111dbf_caseD_1:
          uVar44 = uVar44 & uVar22;
          break;
        case 2:
switchD_00111dbf_caseD_2:
          uVar44 = uVar44 | uVar22;
          break;
        case 3:
switchD_00111dbf_caseD_3:
          uVar44 = uVar44 ^ uVar22;
        }
      }
      else {
        uVar22 = *puVar19;
        if ((uVar48 < uVar30) && ((int)(0x20 - uVar40) < (int)uVar30)) {
          puVar45 = puVar19 + 1;
          puVar19 = puVar19 + 2;
          uVar44 = *puVar45 >> sVar21 & local_144 | uVar22 << sVar20;
          uVar26 = ~local_144 & *puVar45 << sVar20;
        }
        else {
          puVar19 = puVar19 + 1;
          if (uVar48 < uVar30) {
            uVar44 = uVar22 << sVar20;
          }
          else {
            uVar44 = uVar22 >> sVar21 & local_144;
            uVar26 = ~local_144 & uVar22 << sVar20;
          }
        }
        uVar44 = uVar44 ^ uVar10;
        if ((int)uVar48 < iVar15) goto LAB_00111d9a;
        uVar28 = *puVar35;
        switch(uVar12) {
        case 1:
          uVar44 = uVar44 & uVar28;
          break;
        case 2:
          uVar44 = uVar44 | uVar28;
          break;
        case 3:
          uVar44 = uVar44 ^ uVar28;
        }
        *puVar35 = uVar44 & uVar46 | uVar28 & ~uVar46;
        puVar32 = puVar35 + 1;
        if (uVar30 == uVar48) {
          if (uVar11 == 0) {
            switch(uVar12) {
            case 0:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + 1;
                  *puVar32 = uVar44;
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 1:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  *puVar32 = *puVar32 & *puVar19;
                  puVar19 = puVar19 + 1;
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 2:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  *puVar32 = *puVar32 | *puVar19;
                  puVar19 = puVar19 + 1;
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 3:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  *puVar32 = *puVar32 ^ *puVar19;
                  puVar19 = puVar19 + 1;
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
            }
          }
          else {
            switch(uVar12) {
            case 0:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + 1;
                  *puVar32 = ~uVar44;
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 1:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  *puVar32 = *puVar32 & ~*puVar19;
                  puVar19 = puVar19 + 1;
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 2:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  *puVar32 = *puVar32 | ~*puVar19;
                  puVar19 = puVar19 + 1;
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
              break;
            case 3:
              if (0 < (int)uVar41) {
                uVar28 = uVar41 + 1;
                do {
                  uVar44 = *puVar19;
                  puVar19 = puVar19 + 1;
                  *puVar32 = ~(uVar44 ^ *puVar32);
                  puVar32 = puVar32 + 1;
                  uVar28 = uVar28 - 1;
                } while (1 < uVar28);
              }
            }
          }
        }
        else if (uVar11 == 0) {
          switch(uVar12) {
          case 0:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              do {
                uVar44 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar22 = uVar44 >> sVar21 | uVar26;
                uVar26 = uVar44 << sVar20;
                *puVar32 = uVar22;
                puVar32 = puVar32 + 1;
                uVar28 = uVar28 - 1;
              } while (1 < uVar28);
            }
            break;
          case 1:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              uVar44 = uVar26;
              do {
                uVar22 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar26 = uVar22 << sVar20;
                *puVar32 = *puVar32 & (uVar22 >> sVar21 | uVar44);
                puVar32 = puVar32 + 1;
                uVar28 = uVar28 - 1;
                uVar44 = uVar26;
              } while (1 < uVar28);
            }
            break;
          case 2:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              puVar45 = puVar32;
              uVar44 = uVar26;
              do {
                uVar22 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar26 = uVar22 << sVar20;
                puVar32 = puVar45 + 1;
                *puVar45 = uVar44 | *puVar45 | uVar22 >> sVar21;
                uVar28 = uVar28 - 1;
                puVar45 = puVar32;
                uVar44 = uVar26;
              } while (1 < uVar28);
            }
            break;
          case 3:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              uVar44 = uVar26;
              do {
                uVar22 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar26 = uVar22 << sVar20;
                *puVar32 = *puVar32 ^ (uVar22 >> sVar21 | uVar44);
                puVar32 = puVar32 + 1;
                uVar28 = uVar28 - 1;
                uVar44 = uVar26;
              } while (1 < uVar28);
            }
          }
        }
        else {
          switch(uVar12) {
          case 0:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              do {
                uVar44 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar22 = uVar44 >> sVar21 | uVar26;
                uVar26 = uVar44 << sVar20;
                *puVar32 = ~uVar22;
                puVar32 = puVar32 + 1;
                uVar28 = uVar28 - 1;
              } while (1 < uVar28);
            }
            break;
          case 1:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              do {
                uVar44 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar22 = uVar44 >> sVar21 | uVar26;
                uVar26 = uVar44 << sVar20;
                *puVar32 = *puVar32 & ~uVar22;
                puVar32 = puVar32 + 1;
                uVar28 = uVar28 - 1;
              } while (1 < uVar28);
            }
            break;
          case 2:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              do {
                uVar44 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar22 = uVar44 >> sVar21 | uVar26;
                uVar26 = uVar44 << sVar20;
                *puVar32 = *puVar32 | ~uVar22;
                puVar32 = puVar32 + 1;
                uVar28 = uVar28 - 1;
              } while (1 < uVar28);
            }
            break;
          case 3:
            if (0 < (int)uVar41) {
              uVar28 = uVar41 + 1;
              puVar45 = puVar32;
              do {
                uVar44 = *puVar19;
                puVar19 = puVar19 + 1;
                uVar22 = uVar44 >> sVar21 | uVar26;
                uVar26 = uVar44 << sVar20;
                puVar32 = puVar45 + 1;
                *puVar45 = ~(uVar22 ^ *puVar45);
                uVar28 = uVar28 - 1;
                puVar45 = puVar32;
              } while (1 < uVar28);
            }
          }
        }
        if (uVar38 == 0x1f) goto LAB_001123c6;
        uVar44 = uVar26;
        if (uVar16 <= uVar38) {
          uVar44 = *puVar19 >> sVar21 & local_144 | uVar26;
        }
        uVar44 = uVar44 ^ uVar10;
        uVar22 = *puVar32;
        uVar27 = ~local_130 & uVar22;
        uVar28 = local_130;
        switch(uVar12) {
        case 1:
          goto switchD_00111dbf_caseD_1;
        case 2:
          goto switchD_00111dbf_caseD_2;
        case 3:
          goto switchD_00111dbf_caseD_3;
        }
      }
      *puVar32 = uVar28 & uVar44 | uVar27;
    }
    else {
      uVar36 = uVar30 - uVar48 & 0xf;
      uVar44 = CONCAT22(*local_d8,*local_d8) << (sbyte)uVar36;
      uVar44 = (uVar44 >> 0x10 | uVar44) ^ (int)(short)-uVar11;
      if ((int)uVar48 < iVar15) goto LAB_00111d9a;
      uVar28 = *puVar35;
      uVar22 = ~uVar46 & uVar28;
      switch(uVar12) {
      case 0:
        *puVar35 = uVar44 & uVar46 | uVar22;
        puVar32 = puVar35 + 1;
        if ((int)uVar41 < 1) {
LAB_00111d68:
          puVar32 = puVar35 + 1;
        }
        else {
          uVar28 = uVar41 + 1;
          do {
            *puVar32 = uVar44;
            puVar32 = puVar32 + 1;
            uVar28 = uVar28 - 1;
          } while (1 < uVar28);
        }
        break;
      case 1:
        *puVar35 = uVar28 & uVar44 & uVar46 | uVar22;
        puVar32 = puVar35 + 1;
        if ((int)uVar41 < 1) goto LAB_00111d68;
        uVar28 = uVar41 + 1;
        do {
          *puVar32 = *puVar32 & uVar44;
          puVar32 = puVar32 + 1;
          uVar28 = uVar28 - 1;
        } while (1 < uVar28);
        break;
      case 2:
        *puVar35 = (uVar28 | uVar44) & uVar46 | uVar22;
        puVar32 = puVar35 + 1;
        if ((int)uVar41 < 1) goto LAB_00111d68;
        uVar28 = uVar41 + 1;
        do {
          *puVar32 = *puVar32 | uVar44;
          puVar32 = puVar32 + 1;
          uVar28 = uVar28 - 1;
        } while (1 < uVar28);
        break;
      case 3:
        *puVar35 = (uVar28 ^ uVar44) & uVar46 | uVar22;
        puVar32 = puVar35 + 1;
        if ((int)uVar41 < 1) goto LAB_00111d68;
        uVar28 = uVar41 + 1;
        do {
          *puVar32 = *puVar32 ^ uVar44;
          puVar32 = puVar32 + 1;
          uVar28 = uVar28 - 1;
        } while (1 < uVar28);
      }
      uVar28 = local_130;
      if (uVar38 != 0x1f) goto LAB_00111d9a;
    }
LAB_001123c6:
    if ((uVar8 >> 0xc & 1) != 0) break;
    lVar18 = lVar17;
    uVar29 = (long)(iVar33 >> 5);
    if ((short)DVar6 < 0) {
      if ((local_114 & 0x1f) != 0) {
        uVar36 = uVar38 + uVar47;
        lVar18 = -(ulong)(0x1f - uVar36 >> 5);
        if (-1 < (int)uVar36) {
          lVar18 = 0;
        }
        uVar38 = uVar36 & 0x1f;
        uVar30 = (uint)uVar2;
        iVar37 = uVar36 - uVar30;
        uVar46 = -1 << (~(byte)uVar38 & 0x1f);
        uVar48 = iVar37 + 1U & 0x1f;
        local_130 = -(uint)(uVar48 == 0) | ~(-1 << (-(char)uVar48 & 0x1fU));
        local_140 = local_130 & uVar46;
        uVar36 = (uVar38 ^ 0xffffffff) + uVar30;
        uVar41 = uVar36 >> 5;
        if ((int)uVar36 < 1) {
          uVar41 = 0;
        }
        uVar36 = uVar16 + iVar33;
        uVar29 = (ulong)(uVar36 >> 5);
        if ((int)uVar36 < 0) {
          uVar29 = -(ulong)(0x1f - uVar36 >> 5);
        }
        uVar16 = uVar36 & 0x1f;
        iVar39 = uVar36 - uVar30;
        uVar30 = iVar39 + 1U & 0x1f;
        local_148 = iVar37 - iVar39 & 0x1f;
        uVar36 = iVar39 - iVar37 & 0x1f;
        local_144 = ~(-1 << (sbyte)uVar36);
      }
    }
    else if ((local_114 & 0x1f) != 0) {
      uVar28 = uVar48 + uVar47;
      uVar48 = uVar28 & 0x1f;
      uVar38 = (uVar48 + uVar2) - 1 & 0x1f;
      uVar46 = -(uint)(uVar48 == 0) | ~(-1 << (-(char)uVar48 & 0x1fU));
      local_130 = -1 << (~(byte)uVar38 & 0x1f);
      local_140 = local_130 & uVar46;
      uVar41 = (uVar48 + uVar2 >> 5) - 1;
      uVar44 = uVar30 + iVar33;
      uVar30 = uVar44 & 0x1f;
      uVar16 = uVar2 + 0x1f + uVar44 & 0x1f;
      local_148 = uVar28 - uVar44 & 0x1f;
      uVar36 = uVar44 - uVar28 & 0x1f;
      local_144 = -(uint)(uVar36 == 0) | ~(-1 << (sbyte)uVar36);
      lVar18 = (long)((int)uVar28 >> 5);
      uVar29 = (long)((int)uVar44 >> 5);
    }
    puVar35 = puVar35 + lVar18;
    puVar19 = puVar31 + uVar29;
    bVar9 = (int)uVar43 < 2;
    puVar31 = puVar19;
    uVar43 = uVar43 - 1;
    if (bVar9) goto LAB_001129f1;
  } while( true );
  lVar18 = lVar17;
  if ((local_114 & 0x1f) != 0) {
    uVar48 = uVar13 + uVar47;
    uVar13 = uVar48 & 0x1f;
    local_11c = (uVar13 + uVar2) - 1 & 0x1f;
    local_128 = -1 << (~(byte)local_11c & 0x1f);
    local_124 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
    local_12c = local_128 & local_124;
    local_120 = (uVar13 + uVar2 >> 5) - 1;
    lVar18 = (long)((int)uVar48 >> 5);
  }
  local_a0 = local_a0 + lVar18;
  pDVar1 = local_d8 + -(ulong)(uVar7 & 0xf);
  bVar9 = (int)(uVar7 & 0xf) <= (int)uVar14;
  uVar14 = uVar14 + 1;
  local_d8 = local_d8 + 1;
  if (bVar9) {
    uVar14 = 0;
    local_d8 = pDVar1;
  }
  bVar9 = (int)uVar42 < 2;
  uVar42 = uVar43 - 1;
  if (bVar9) {
LAB_001129f1:
    flush_display_lineregion((ulong)uVar4,ybase,(uint)uVar2,(uint)uVar3);
    ScreenLocked = 0;
    return pilot_bt_tbl;
  }
  goto LAB_00111a9f;
}

Assistant:

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl, LispPTR tos)
{
  PILOTBBT *pbt;
  DLword *srcbase, *dstbase;
#if defined(SUNDISPLAY) || defined(DOS)
  int displayflg;
#endif
  int sx, dx, w, h, srcbpl, dstbpl, backwardflg;
  int src_comp, op, gray, num_gray, curr_gray_line;

#ifdef INIT

  /* for init, we have to initialize the pointers at the
     first call to pilotbitblt or we die.  If we do it
     earlier we die also.  We set a new flag so we don't
     do it more than once which is a lose also.

     I put this in an ifdef so there won't be any extra
     code when making a regular LDE.  */

  if (!kbd_for_makeinit) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }

#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(pilot_bt_tbl);

  w = pbt->pbtwidth;
  h = pbt->pbtheight;
  if ((h <= 0) || (w <= 0)) return (pilot_bt_tbl);
  dx = pbt->pbtdestbit;
  sx = pbt->pbtsourcebit;
  backwardflg = pbt->pbtbackward;
/* if displayflg != 0 then source or destination is DisplayBitMap */
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#if defined(SUNDISPLAY) || defined(DOS)
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (dx >> 4)), w, h, backwardflg) ||
               cursorin(pbt->pbtsourcehi, (pbt->pbtsourcelo + (sx >> 4)), w, h, backwardflg);
#endif /* SUNDISPLAY */

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));
  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = pbt->pbtsourcebpl;
  dstbpl = pbt->pbtdestbpl;
  src_comp = pbt->pbtsourcetype;
  op = pbt->pbtoperation;
  gray = pbt->pbtusegray;
  num_gray = ((TEXTUREBBT *)pbt)->pbtgrayheightlessone + 1;
  curr_gray_line = ((TEXTUREBBT *)pbt)->pbtgrayoffset;

#ifdef DOS
  if (displayflg) (currentdsp->mouse_invisible)(currentdsp, IOPage);
  ;
#endif /* SUNDISPLAY / DOS */

  new_bitblt_code;

#ifdef DOS
      flush_display_lineregion(dx, dstbase, w, h);
  if (displayflg) (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
#endif /* SUNDISPLAY / DOS */

#if defined(XWINDOW) || defined(SDL)
  flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

  return (pilot_bt_tbl);

}